

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

void os_gen_charmap_filename(char *filename,char *internal_id,char *param_3)

{
  char *in_RSI;
  char *in_RDI;
  size_t len;
  char mapname [32];
  size_t local_40;
  char local_38 [4];
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  
  os_get_charmap(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  local_40 = strlen(local_38);
  if (0xff7 < local_40) {
    local_40 = 0xff7;
  }
  memcpy(in_RDI,local_38,local_40);
  strcat(in_RDI,in_RSI);
  strcat(in_RDI,".tcp");
  return;
}

Assistant:

void
os_gen_charmap_filename( char* filename, char* internal_id, char* /*argv0*/ )
{
    char mapname[32];

    os_get_charmap(mapname, OS_CHARMAP_DISPLAY);

    // Theoretically, we can get mapname so long that with 4-letter
    // internal id and 4-letter extension '.tcp' it will be longer
    // than OSFNMAX. Highly unlikely, but...
    size_t len = strlen(mapname);
    if (len > OSFNMAX - 9) len = OSFNMAX - 9;

    memcpy(filename, mapname, len);
    strcat(filename, internal_id);
    strcat(filename, ".tcp");
}